

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O2

BlendFunc deqp::gles31::Functional::anon_unknown_0::getRandomBlendFunc(Random *rng)

{
  deUint32 dVar1;
  deUint32 dVar2;
  BlendFunc BVar3;
  
  dVar1 = deRandom_getUint32(&rng->m_rnd);
  dVar1 = *(deUint32 *)(&DAT_0085b600 + ((ulong)dVar1 % 0xf) * 4);
  dVar2 = deRandom_getUint32(&rng->m_rnd);
  BVar3.dst = *(deUint32 *)(&DAT_0085b600 + ((ulong)dVar2 % 0xf) * 4);
  BVar3.src = dVar1;
  return BVar3;
}

Assistant:

BlendFunc getRandomBlendFunc (de::Random& rng)
{
	const deUint32 funcs[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_DST_COLOR,
		GL_ONE_MINUS_DST_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
		GL_DST_ALPHA,
		GL_ONE_MINUS_DST_ALPHA,
		GL_CONSTANT_COLOR,
		GL_ONE_MINUS_CONSTANT_COLOR,
		GL_CONSTANT_ALPHA,
		GL_ONE_MINUS_CONSTANT_ALPHA,
		GL_SRC_ALPHA_SATURATE
	};

	const deUint32 src = de::getSizedArrayElement<DE_LENGTH_OF_ARRAY(funcs)>(funcs, rng.getUint32() % DE_LENGTH_OF_ARRAY(funcs));
	const deUint32 dst = de::getSizedArrayElement<DE_LENGTH_OF_ARRAY(funcs)>(funcs, rng.getUint32() % DE_LENGTH_OF_ARRAY(funcs));

	return BlendFunc(src, dst);
}